

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* __thiscall
AlignmentRecord::referenceString
          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,AlignmentRecord *this,
          vector<char,_std::allocator<char>_> *cigarData,int startPosition,string *sequence,
          string *qualities,string *reference)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
  *this_00;
  int iVar5;
  pointer pcVar6;
  long lVar7;
  ulong uVar8;
  char *__end;
  ulong uVar9;
  ulong uVar10;
  vector<char,_std::allocator<char>_> *__range1;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  vector<int,_std::allocator<int>_> qualityList;
  string alignSeq;
  string replaceString;
  string constructedReference;
  vector<int,_std::allocator<int>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  char local_98 [16];
  string *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  locale local_40 [8];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
  *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_88 = qualities;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"","");
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  pcVar6 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar6 != pcVar2) {
    lVar7 = 0;
    do {
      if ((pcVar6[lVar7] != 'S') && (pcVar6[lVar7] != 'H')) break;
      lVar4 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (pcVar6 + lVar4 != pcVar2);
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"G","");
  pcVar6 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  if ((cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar6) {
    uVar12 = 0;
    iVar13 = 0;
    do {
      switch(pcVar6[uVar12]) {
      case 'D':
        std::__cxx11::string::push_back((char)&local_c8);
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current =
             local_a8.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_current & 0xffffffff00000000;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::string::push_back((char)&local_60);
      default:
        goto switchD_00163ca9_caseD_45;
      case 'H':
        std::__cxx11::string::push_back((char)&local_c8);
        if (local_88->_M_string_length <= (ulong)(long)iVar13) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        }
        iVar5 = (local_88->_M_dataplus)._M_p[iVar13] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar5;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::string::push_back((char)&local_60);
        break;
      case 'I':
        uVar10 = (ulong)iVar13;
        uVar8 = sequence->_M_string_length;
        if (sequence->_M_string_length <= uVar10) goto LAB_001646f5;
        std::__cxx11::string::push_back((char)&local_c8);
        if (local_88->_M_string_length <= uVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
        }
        iVar5 = (local_88->_M_dataplus)._M_p[uVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar5;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::__cxx11::string::push_back((char)&local_60);
        goto LAB_0016459a;
      case 'M':
        std::__cxx11::string::push_back((char)&local_60);
        uVar3 = sequence->_M_string_length;
        if (iVar13 == 0) {
          uVar10 = 0;
LAB_00164489:
          uVar8 = uVar3;
          if (uVar3 <= uVar10) {
LAB_001646f5:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10,
                       uVar8);
          }
          std::__cxx11::string::push_back((char)&local_c8);
        }
        else {
          uVar11 = (ulong)iVar13;
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar11];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_00164489;
          uVar9 = local_c8._M_string_length - 1;
          if (local_c8._M_string_length == 0) {
LAB_00164706:
            uVar8 = 0;
            uVar10 = uVar9;
            goto LAB_001646f5;
          }
          if (local_c8._M_dataplus._M_p[uVar9] == 'G') goto LAB_00164489;
          uVar8 = local_60._M_string_length;
          uVar10 = uVar9;
          if (local_60._M_string_length <= uVar9) goto LAB_001646f5;
          uVar10 = uVar11;
          if (local_60._M_dataplus._M_p[uVar9] != 'G') goto LAB_00164489;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_c8);
          uVar8 = sequence->_M_string_length;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
          uVar8 = sequence->_M_string_length;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar13 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19a4e2);
        }
        if (local_88->_M_string_length <= uVar10) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
        }
        iVar5 = (local_88->_M_dataplus)._M_p[uVar10] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar5;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
LAB_00164540:
          *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        break;
      case 'N':
        std::__cxx11::string::push_back((char)&local_60);
        uVar3 = sequence->_M_string_length;
        if (iVar13 == 0) {
          uVar11 = 0;
LAB_001644f0:
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
        }
        else {
          uVar11 = (ulong)iVar13;
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar11];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_001644f0;
          uVar9 = local_c8._M_string_length - 1;
          if (local_c8._M_string_length == 0) goto LAB_00164706;
          if (local_c8._M_dataplus._M_p[uVar9] == 'G') goto LAB_001644f0;
          uVar8 = local_60._M_string_length;
          uVar10 = uVar9;
          if (local_60._M_string_length <= uVar9) goto LAB_001646f5;
          if (local_60._M_dataplus._M_p[uVar9] != 'G') goto LAB_001644f0;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_c8);
          uVar8 = sequence->_M_string_length;
          uVar10 = uVar11;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
          uVar8 = sequence->_M_string_length;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar13 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19a4e2);
        }
        if (local_88->_M_string_length <= uVar11) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
        }
        iVar5 = (local_88->_M_dataplus)._M_p[uVar11] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar5;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00164540;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_a8);
        break;
      case 'P':
        std::__cxx11::string::push_back((char)&local_60);
        uVar3 = sequence->_M_string_length;
        if (iVar13 == 0) {
          uVar11 = 0;
LAB_0016437f:
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
        }
        else {
          uVar11 = (ulong)iVar13;
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar11];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_0016437f;
          uVar9 = local_c8._M_string_length - 1;
          if (local_c8._M_string_length == 0) goto LAB_00164706;
          if (local_c8._M_dataplus._M_p[uVar9] == 'G') goto LAB_0016437f;
          uVar8 = local_60._M_string_length;
          uVar10 = uVar9;
          if (local_60._M_string_length <= uVar9) goto LAB_001646f5;
          if (local_60._M_dataplus._M_p[uVar9] != 'G') goto LAB_0016437f;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_c8);
          uVar8 = sequence->_M_string_length;
          uVar10 = uVar11;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
          uVar8 = sequence->_M_string_length;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar13 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19a4e2);
        }
        if (local_88->_M_string_length <= uVar11) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
        }
        iVar5 = (local_88->_M_dataplus)._M_p[uVar11] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar5;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00164540;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_a8);
        break;
      case 'S':
        std::__cxx11::string::push_back((char)&local_60);
        uVar3 = sequence->_M_string_length;
        if (iVar13 == 0) {
          uVar11 = 0;
LAB_0016441d:
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
        }
        else {
          uVar11 = (ulong)iVar13;
          uVar8 = uVar3;
          uVar10 = uVar11;
          if (uVar3 <= uVar11) goto LAB_001646f5;
          cVar1 = (sequence->_M_dataplus)._M_p[uVar11];
          if ((cVar1 != 'T') && (cVar1 != 'C')) goto LAB_0016441d;
          uVar9 = local_c8._M_string_length - 1;
          if (local_c8._M_string_length == 0) goto LAB_00164706;
          if (local_c8._M_dataplus._M_p[uVar9] == 'G') goto LAB_0016441d;
          uVar8 = local_60._M_string_length;
          uVar10 = uVar9;
          if (local_60._M_string_length <= uVar9) goto LAB_001646f5;
          if (local_60._M_dataplus._M_p[uVar9] != 'G') goto LAB_0016441d;
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if (local_a8.
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin._M_current != local_98) {
            operator_delete(local_a8.
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                            .
                            super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin._M_current);
          }
          std::__cxx11::string::append((char *)&local_c8);
          uVar8 = sequence->_M_string_length;
          uVar10 = uVar11;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_c8);
          uVar8 = sequence->_M_string_length;
          if (sequence->_M_string_length <= uVar11) goto LAB_001646f5;
          std::__cxx11::string::push_back((char)&local_80);
          std::__cxx11::string::replace
                    ((ulong)sequence,(long)(iVar13 + -1),(char *)0x2,(ulong)local_80);
          std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x19a4e2);
        }
        if (local_88->_M_string_length <= uVar11) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
        }
        iVar5 = (local_88->_M_dataplus)._M_p[uVar11] + -0x21;
        local_a8.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current._0_4_ = iVar5;
        if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_a8);
        }
        else {
          *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
LAB_0016459a:
        iVar13 = iVar13 + 1;
        goto switchD_00163ca9_caseD_45;
      }
      iVar13 = iVar13 + 1;
switchD_00163ca9_caseD_45:
      uVar12 = uVar12 + 1;
      pcVar6 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(cigarData->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pcVar6));
  }
  std::__cxx11::string::push_back((char)&local_60);
  this_00 = local_38;
  std::locale::locale(local_40);
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_60._M_dataplus._M_p + local_60._M_string_length;
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_60._M_dataplus._M_p;
  boost::algorithm::detail::
  transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_upperF<char>>
            (&local_a8,local_40);
  std::locale::~locale(local_40);
  std::locale::locale(local_40);
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_c8._M_dataplus._M_p + local_c8._M_string_length;
  local_a8.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_c8._M_dataplus._M_p;
  boost::algorithm::detail::
  transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_upperF<char>>
            (&local_a8,local_40);
  std::locale::~locale(local_40);
  std::
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&,void>
            (this_00,&local_60,&local_c8,&local_e8);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
          *)this_00;
}

Assistant:

std::tuple<string,string,vector<int>> AlignmentRecord::referenceString(const std::vector<char> cigarData, int startPosition, std::string& sequence, string  qualities, string & reference){

    string constructedReference = "";
    string alignSeq="";
    vector<int> qualityList;
    int referenceCounter = startPosition-computeOffset(cigarData);
    int sequenceCounter=0;//this is the quality counter as well
    string replaceString = "G";

    for ( int s = 0; s < cigarData.size(); s++) {
        if (cigarData[s] == 'I') {
            alignSeq+=sequence.at(sequenceCounter);
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            constructedReference +='I';
        }else if (cigarData[s] == 'D'){
            alignSeq+='D';
            qualityList.push_back(0);
            constructedReference += (reference)[referenceCounter];
            referenceCounter++;
        }else if (cigarData[s] == 'S'){
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            referenceCounter++;
            sequenceCounter++;
        }else if (cigarData[s] == 'H'){
            alignSeq+='H';
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            constructedReference += 'H';
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'M') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'N') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'P') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else {
            assert(false);
        }
    }
    constructedReference+=reference[referenceCounter];


    if(cigarData.size()!=constructedReference.size()-1){
        assert(false);
    }
    boost::algorithm::to_upper(constructedReference);
    boost::algorithm::to_upper(alignSeq);
    return std::make_tuple(constructedReference,alignSeq,qualityList);

}